

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

void secp256k1_ecdsa_signature_load
               (secp256k1_context *ctx,secp256k1_scalar *r,secp256k1_scalar *s,
               secp256k1_ecdsa_signature *sig)

{
  uchar *in_RCX;
  secp256k1_scalar *in_RDX;
  secp256k1_scalar *in_RSI;
  
  secp256k1_scalar_set_b32(in_RSI,in_RCX,(int *)0x0);
  secp256k1_scalar_set_b32(in_RDX,in_RCX + 0x20,(int *)0x0);
  return;
}

Assistant:

static void secp256k1_ecdsa_signature_load(const secp256k1_context* ctx, secp256k1_scalar* r, secp256k1_scalar* s, const secp256k1_ecdsa_signature* sig) {
    (void)ctx;
    if (sizeof(secp256k1_scalar) == 32) {
        /* When the secp256k1_scalar type is exactly 32 byte, use its
         * representation inside secp256k1_ecdsa_signature, as conversion is very fast.
         * Note that secp256k1_ecdsa_signature_save must use the same representation. */
        memcpy(r, &sig->data[0], 32);
        memcpy(s, &sig->data[32], 32);
    } else {
        secp256k1_scalar_set_b32(r, &sig->data[0], NULL);
        secp256k1_scalar_set_b32(s, &sig->data[32], NULL);
    }
}